

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausProcessClausesCut3(Clu_Man_t *p,Fra_Sml_t *pSimMan,Aig_Cut_t *pCut,int *pScores)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  uint uVar12;
  uint Matrix [32];
  uint *pSims [16];
  uint local_138 [31];
  undefined1 auStack_bc [4];
  long local_b8 [17];
  
  bVar1 = pCut->nFanins;
  if (0xe < (byte)(bVar1 - 2)) {
    __assert_fail("pCut->nFanins > 1 && pCut->nFanins < 17",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x12a,
                  "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)");
  }
  iVar6 = pSimMan->nWordsTotal;
  iVar3 = p->nSimWordsPref;
  uVar8 = iVar6 - iVar3;
  if ((uVar8 & 7) != 0) {
    __assert_fail("nWordsForSim % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,299,
                  "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)");
  }
  if (bVar1 != 0) {
    uVar9 = 0;
    do {
      local_b8[uVar9] =
           (long)&pSimMan[1].pAig +
           (long)*(int *)((long)&pCut[1].pNext + uVar9 * 4) * (long)iVar6 * 4 + (long)iVar3 * 4;
      uVar9 = uVar9 + 1;
    } while (bVar1 != uVar9);
  }
  memset(pScores,0,(long)(1 << (bVar1 & 0x1f)) << 2);
  if (pCut->nLeafMax == '\x04') {
    if (0 < (int)uVar8 >> 3) {
      cVar2 = pCut->nFanins;
      uVar9 = 0;
      do {
        local_138[0x1c] = 0;
        local_138[0x1d] = 0;
        stack0xffffffffffffff40 = 0;
        local_138[0x18] = 0;
        local_138[0x19] = 0;
        local_138[0x1a] = 0;
        local_138[0x1b] = 0;
        local_138[0x14] = 0;
        local_138[0x15] = 0;
        local_138[0x16] = 0;
        local_138[0x17] = 0;
        local_138[0x10] = 0;
        local_138[0x11] = 0;
        local_138[0x12] = 0;
        local_138[0x13] = 0;
        local_138[0xc] = 0;
        local_138[0xd] = 0;
        local_138[0xe] = 0;
        local_138[0xf] = 0;
        local_138[8] = 0;
        local_138[9] = 0;
        local_138[10] = 0;
        local_138[0xb] = 0;
        local_138[4] = 0;
        local_138[5] = 0;
        local_138[6] = 0;
        local_138[7] = 0;
        local_138[0] = 0;
        local_138[1] = 0;
        local_138[2] = 0;
        local_138[3] = 0;
        puVar5 = auStack_bc;
        lVar7 = 0;
        do {
          if ('\0' < cVar2) {
            lVar11 = 0;
            plVar10 = local_b8;
            do {
              *(undefined4 *)(puVar5 + lVar11 * 4) =
                   *(undefined4 *)(uVar9 * 0x20 + *plVar10 + lVar7 * 4);
              lVar11 = lVar11 + -1;
              plVar10 = plVar10 + 1;
            } while (-lVar11 != (long)cVar2);
          }
          lVar7 = lVar7 + 1;
          puVar5 = puVar5 + -0x10;
        } while (lVar7 != 8);
        transpose32a(local_138);
        lVar7 = 0;
        do {
          uVar4 = local_138[lVar7];
          iVar6 = 8;
          do {
            pScores[uVar4 & 0xf] = pScores[uVar4 & 0xf] + 1;
            uVar4 = uVar4 >> 4;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)((int)uVar8 >> 3));
    }
  }
  else if (0 < (int)uVar8) {
    cVar2 = pCut->nFanins;
    uVar9 = 0;
    do {
      iVar6 = 0;
      do {
        if (cVar2 < '\x01') {
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          uVar4 = 0;
          do {
            uVar12 = 1 << ((byte)lVar7 & 0x1f);
            if ((*(uint *)(local_b8[lVar7] + uVar9 * 4) & 1 << ((byte)iVar6 & 0x1f)) == 0) {
              uVar12 = 0;
            }
            uVar4 = uVar4 | uVar12;
            lVar7 = lVar7 + 1;
          } while (cVar2 != lVar7);
          lVar7 = (long)(int)uVar4;
        }
        pScores[lVar7] = pScores[lVar7] + 1;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  return;
}

Assistant:

void Fra_ClausProcessClausesCut3( Clu_Man_t * p, Fra_Sml_t * pSimMan, Aig_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int iMint, i, j, k, b, nMints, nSeries;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;

    // compute parameters
    assert( pCut->nFanins > 1 && pCut->nFanins < 17 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pFanins[i] ) + p->nSimWordsPref;
    // add combinational patterns
    nMints = (1 << pCut->nFanins);
    memset( pScores, 0, sizeof(int) * nMints );

    if ( pCut->nLeafMax == 4 )
    {
        // convert the simulation patterns
        nSeries = nWordsForSim / 8;
        for ( i = 0; i < nSeries; i++ )
        {
            memset( Matrix, 0, sizeof(unsigned) * 32 );
            for ( k = 0; k < 8; k++ )
                for ( j = 0; j < (int)pCut->nFanins; j++ )
                    Matrix[31-(k*4+j)] = pSims[j][i*8+k];
            transpose32a( Matrix );
            for ( k = 0; k < 32; k++ )
                for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                    pScores[uWord & 0xF]++;
        }
    }
    else
    {
        // go through the simulation patterns
        for ( i = 0; i < nWordsForSim; i++ )
            for ( k = 0; k < 32; k++ )
            {
                iMint = 0;
                for ( b = 0; b < (int)pCut->nFanins; b++ )
                    if ( pSims[b][i] & (1 << k) )
                        iMint |= (1 << b);
                pScores[iMint]++;
            }
    }
}